

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O2

bool __thiscall NewChangeDot::CreateDirsWithHashTitle(NewChangeDot *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char cVar1;
  reference pvVar2;
  Logger *pLVar3;
  Tools *this_00;
  byte bVar4;
  ulong __n;
  allocator<char> local_609;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_608;
  uint local_5fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  string local_5b8;
  string local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string local_558;
  string local_538 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498 [32];
  string local_478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ofstream file;
  byte abStack_418 [480];
  ifstream dir;
  
  std::ifstream::ifstream(&dir);
  local_608 = &(this->
               super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ).files;
  __rhs = &(this->
           super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ).shortHashName;
  local_5fc = (uint)CONCAT71((int7)((ulong)__rhs >> 8),1);
  for (__n = 0; __n < (ulong)((long)(this->
                                    super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ).files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->
                                    super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ).files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((this->
                  super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).hashNames,__n);
    std::__cxx11::string::substr((ulong)&file,(ulong)pvVar2);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f8,
               (((this->
                 super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).path)->_M_dataplus)._M_p,(allocator<char> *)&local_578);
    std::operator+(&local_5d8,&local_5f8,"/objects/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   &local_5d8,__rhs);
    std::ifstream::open((string *)&dir,
                        (_Ios_Openmode)
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      pLVar3 = Logger::getInstance();
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(local_608,__n);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                     "Directory ",pvVar2);
      std::operator+(&local_458,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                     " didn\'t create");
      Logger::LogError(pLVar3,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&file);
      local_5fc = 0;
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(local_608,__n);
      std::__cxx11::string::string(local_478,(string *)pvVar2);
      std::__cxx11::string::string(local_498,(string *)__rhs);
      (*(this->
        super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._vptr_NewChangeBase[2])(this,local_478,local_498);
      std::__cxx11::string::~string(local_498);
      std::__cxx11::string::~string(local_478);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,
                 (((this->
                   super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).path)->_M_dataplus)._M_p,&local_609);
      std::operator+(&local_4f8,&local_518,"/objects/");
      std::operator+(&local_578,&local_4f8,__rhs);
      std::operator+(&local_5f8,&local_578,"/");
      std::operator+(&local_5d8,&local_5f8,__rhs);
      std::ofstream::ofstream(&file,(string *)&local_5d8,_S_out);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      if ((abStack_418[*(long *)(_file + -0x18)] & 5) != 0) {
        pLVar3 = Logger::getInstance();
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(local_608,__n);
        std::operator+(&local_5f8,"file ",pvVar2);
        std::operator+(&local_5d8,&local_5f8," didn\'t add in ");
        std::operator+(&local_4b8,&local_5d8,__rhs);
        Logger::LogError(pLVar3,&local_4b8);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)&local_5f8);
      }
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((this->
                    super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ).hashNames,__n);
      std::operator<<((ostream *)&file,(string *)pvVar2);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(local_608,__n);
      std::__cxx11::string::string(local_538,(string *)pvVar2);
      this_00 = Tools::getInstance();
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(local_608,__n);
      std::__cxx11::string::string((string *)&local_598,(string *)pvVar2);
      Tools::GetFileString(&local_558,this_00,&local_598);
      std::__cxx11::string::string(local_4d8,(string *)__rhs);
      (*(this->
        super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._vptr_NewChangeBase[3])(this,local_538,&local_558,local_4d8);
      std::__cxx11::string::~string(local_4d8);
      std::__cxx11::string::~string((string *)&local_558);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string(local_538);
      std::ofstream::~ofstream(&file);
    }
  }
  bVar4 = (byte)local_5fc;
  if ((local_5fc & 1) != 0) {
    pLVar3 = Logger::getInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b8,"Directory created successfully",(allocator<char> *)&file);
    Logger::LogInformation(pLVar3,&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&dir);
  return (bool)(bVar4 & 1);
}

Assistant:

virtual bool CreateDirsWithHashTitle() override {
        ifstream dir;
        bool isCreated = true;

        for (int i = 0; i < this->files.size(); i++) {
            this->shortHashName = this->hashNames->at(i).substr(0, 6);
            dir.open(string(this->path->data()) + "/objects/" + this->shortHashName);
            if (!dir.is_open()) {
                Logger::getInstance()->LogError(
                        "Directory " + this->files.at(i) + " didn't create");
                isCreated = false;
            } else {
                WriteInIndexFile(this->files.at(i), this->shortHashName);
                ofstream file(string(this->path->data()) + "/objects/" + this->shortHashName + "/" +
                              this->shortHashName);
                if (!file) {
                    Logger::getInstance()->LogError(
                            "file " + this->files.at(i) + " didn't add in " + this->shortHashName);
                }
                file << this->hashNames->at(i);
                AddOldVersion(this->files.at(i), Tools::getInstance()->GetFileString(this->files.at(i)),
                              this->shortHashName);
            }
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("Directory created successfully");
        }

        dir.close();

        return isCreated;
    }